

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  undefined1 (*pauVar2) [12];
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  PrimRefMB *pPVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  undefined4 uVar19;
  BufferView<embree::Vec3fa> *pBVar20;
  bool bVar21;
  long lVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  size_t sVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [12];
  vfloat4 a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar47;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar48;
  float fVar49;
  float fVar50;
  uint uVar63;
  float fVar64;
  undefined1 auVar51 [12];
  float fVar65;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar62;
  float fVar66;
  float fVar67;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar83;
  float fVar84;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar118 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar119;
  undefined1 auVar120 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar121;
  undefined1 auVar125 [12];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar129;
  undefined1 auVar132 [12];
  float fVar130;
  float fVar131;
  float fVar137;
  Vec3fa n1;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar136;
  float fVar141;
  float fVar147;
  float fVar149;
  Vec3ff v3;
  float fVar142;
  float fVar148;
  float fVar150;
  float fVar151;
  undefined1 auVar143 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar152;
  float fVar153;
  float fVar157;
  float fVar158;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar156;
  float fVar159;
  float fVar160;
  float fVar163;
  uint uVar164;
  float fVar165;
  float fVar166;
  uint uVar167;
  uint uVar168;
  undefined1 auVar161 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar162;
  undefined1 auVar169 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar170;
  float fVar173;
  float fVar174;
  undefined1 auVar171 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar172;
  float fVar175;
  undefined1 auVar176 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar177;
  undefined1 auVar178 [16];
  uint uVar179;
  uint uVar180;
  uint uVar181;
  uint uVar182;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  BBox1f local_328;
  float fStack_320;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_318;
  ulong local_288;
  unsigned_long local_230;
  size_t local_228;
  size_t local_220;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e8;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1d8;
  ulong local_110;
  anon_class_16_2_07cfa4d6 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar14;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar15 = r->_begin;
  aVar48 = _DAT_01f7aa00;
  aVar121 = _DAT_01f7a9f0;
  aVar156 = _DAT_01f7a9f0;
  aVar162 = _DAT_01f7aa00;
  if (uVar15 < r->_end) {
    fVar50 = 0.0;
    fVar64 = 1.0;
    fVar175 = 1.0;
    local_230 = 0;
    local_228 = 0;
    local_288 = 0;
    local_1e8 = _DAT_01f7aa00;
    local_1d8 = _DAT_01f7a9f0;
    fVar99 = 0.0;
    local_220 = k;
    do {
      local_328 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry
                  .super_Geometry.time_range;
      fVar66 = local_328.lower;
      fVar13 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.fnumTimeSegments;
      fVar30 = t0t1->lower;
      fVar29 = t0t1->upper;
      fVar49 = local_328.upper - fVar66;
      fVar28 = floorf(((fVar30 - fVar66) / fVar49) * 1.0000002 * fVar13);
      fVar49 = ceilf(((fVar29 - fVar66) / fVar49) * 0.99999976 * fVar13);
      uVar23 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar15);
      uVar14 = (ulong)(uVar23 + 3);
      pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar14 < (pBVar4->super_RawBufferView).num) {
        fVar66 = 0.0;
        if (0.0 <= fVar28) {
          fVar66 = fVar28;
        }
        if (fVar13 <= fVar49) {
          fVar49 = fVar13;
        }
        if ((uint)(int)fVar66 <= (uint)(int)fVar49) {
          uVar17 = (ulong)(int)fVar66;
          pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.normals.items;
          fVar28 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                   super_CurveGeometry.maxRadiusScale;
          pBVar20 = pBVar5;
          do {
            pcVar6 = pBVar4[uVar17].super_RawBufferView.ptr_ofs;
            sVar26 = pBVar4[uVar17].super_RawBufferView.stride;
            lVar16 = sVar26 * uVar23;
            lVar22 = sVar26 * (uVar23 + 1);
            lVar25 = sVar26 * (uVar23 + 2);
            lVar18 = sVar26 * uVar14;
            auVar46._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar22 + 0xc)));
            auVar46._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar16 + 0xc)));
            auVar46._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar25 + 0xc)));
            auVar46._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar6 + lVar18 + 0xc)));
            iVar24 = movmskps((int)pBVar20,auVar46);
            if (iVar24 != 0) goto LAB_009dcdbe;
            auVar46 = *(undefined1 (*) [16])(pcVar6 + lVar16);
            fVar83 = auVar46._0_4_;
            fVar173 = auVar46._4_4_;
            fVar174 = auVar46._8_4_;
            fVar66 = auVar46._12_4_;
            auVar61._0_4_ = -(uint)(fVar83 < 1.844e+18 && -1.844e+18 < fVar83);
            auVar61._4_4_ = -(uint)(fVar173 < 1.844e+18 && -1.844e+18 < fVar173);
            auVar61._8_4_ = -(uint)(fVar174 < 1.844e+18 && -1.844e+18 < fVar174);
            auVar61._12_4_ = -(uint)(fVar66 < 1.844e+18 && -1.844e+18 < fVar66);
            uVar19 = movmskps(0,auVar61);
            if ((~(byte)uVar19 & 7) != 0) goto LAB_009dcdbe;
            pfVar1 = (float *)(pcVar6 + lVar22);
            fVar122 = *pfVar1;
            fVar123 = pfVar1[1];
            fVar65 = pfVar1[2];
            fVar115 = pfVar1[3];
            auVar118._0_4_ = -(uint)(fVar122 < 1.844e+18 && -1.844e+18 < fVar122);
            auVar118._4_4_ = -(uint)(fVar123 < 1.844e+18 && -1.844e+18 < fVar123);
            auVar118._8_4_ = -(uint)(fVar65 < 1.844e+18 && -1.844e+18 < fVar65);
            auVar118._12_4_ = -(uint)(fVar115 < 1.844e+18 && -1.844e+18 < fVar115);
            uVar19 = movmskps(CONCAT31((int3)((uint)uVar19 >> 8),~(byte)uVar19),auVar118);
            if ((~(byte)uVar19 & 7) != 0) goto LAB_009dcdbe;
            pfVar1 = (float *)(pcVar6 + lVar25);
            fVar92 = *pfVar1;
            fVar94 = pfVar1[1];
            fVar117 = pfVar1[2];
            fVar116 = pfVar1[3];
            auVar143._0_4_ = -(uint)(fVar92 < 1.844e+18 && -1.844e+18 < fVar92);
            auVar143._4_4_ = -(uint)(fVar94 < 1.844e+18 && -1.844e+18 < fVar94);
            auVar143._8_4_ = -(uint)(fVar117 < 1.844e+18 && -1.844e+18 < fVar117);
            auVar143._12_4_ = -(uint)(fVar116 < 1.844e+18 && -1.844e+18 < fVar116);
            uVar19 = movmskps(CONCAT31((int3)((uint)uVar19 >> 8),~(byte)uVar19),auVar143);
            pBVar20 = (BufferView<embree::Vec3fa> *)
                      (ulong)CONCAT31((int3)((uint)uVar19 >> 8),~(byte)uVar19);
            if ((~(byte)uVar19 & 7) != 0) goto LAB_009dcdbe;
            auVar46 = *(undefined1 (*) [16])(pcVar6 + lVar18);
            fVar141 = auVar46._0_4_;
            fVar147 = auVar46._4_4_;
            fVar149 = auVar46._8_4_;
            fVar151 = auVar46._12_4_;
            auVar169._0_4_ = -(uint)(fVar141 < 1.844e+18 && -1.844e+18 < fVar141);
            auVar169._4_4_ = -(uint)(fVar147 < 1.844e+18 && -1.844e+18 < fVar147);
            auVar169._8_4_ = -(uint)(fVar149 < 1.844e+18 && -1.844e+18 < fVar149);
            auVar169._12_4_ = -(uint)(fVar151 < 1.844e+18 && -1.844e+18 < fVar151);
            uVar19 = movmskps((int)lVar18,auVar169);
            if ((~(byte)uVar19 & 7) != 0) goto LAB_009dcdbe;
            pcVar6 = pBVar5[uVar17].super_RawBufferView.ptr_ofs;
            sVar26 = pBVar5[uVar17].super_RawBufferView.stride;
            lVar16 = sVar26 * uVar23;
            pauVar2 = (undefined1 (*) [12])(pcVar6 + lVar16);
            auVar125 = *pauVar2;
            auVar171._0_4_ =
                 -(uint)(*(float *)*pauVar2 < 1.844e+18 && -1.844e+18 < *(float *)*pauVar2);
            auVar171._4_4_ =
                 -(uint)(*(float *)(*pauVar2 + 4) < 1.844e+18 &&
                        -1.844e+18 < *(float *)(*pauVar2 + 4));
            auVar171._8_4_ =
                 -(uint)(*(float *)(*pauVar2 + 8) < 1.844e+18 &&
                        -1.844e+18 < *(float *)(*pauVar2 + 8));
            auVar171._12_4_ =
                 -(uint)(*(float *)pauVar2[1] < 1.844e+18 && -1.844e+18 < *(float *)pauVar2[1]);
            uVar19 = movmskps((int)lVar16,auVar171);
            if ((~(byte)uVar19 & 7) != 0) goto LAB_009dcdbe;
            lVar16 = sVar26 * (uVar23 + 1);
            auVar46 = *(undefined1 (*) [16])(pcVar6 + lVar16);
            fVar130 = auVar46._0_4_;
            fVar137 = auVar46._4_4_;
            fVar124 = auVar46._8_4_;
            auVar176._0_4_ = -(uint)(fVar130 < 1.844e+18 && -1.844e+18 < fVar130);
            auVar176._4_4_ = -(uint)(fVar137 < 1.844e+18 && -1.844e+18 < fVar137);
            auVar176._8_4_ = -(uint)(fVar124 < 1.844e+18 && -1.844e+18 < fVar124);
            auVar176._12_4_ = -(uint)(auVar46._12_4_ < 1.844e+18 && -1.844e+18 < auVar46._12_4_);
            uVar19 = movmskps((int)lVar16,auVar176);
            if ((~(byte)uVar19 & 7) != 0) goto LAB_009dcdbe;
            fVar66 = fVar66 * fVar28;
            fVar115 = fVar115 * fVar28;
            fVar116 = fVar116 * fVar28;
            fVar151 = fVar151 * fVar28;
            lVar18 = sVar26 * (uVar23 + 2);
            pfVar1 = (float *)(pcVar6 + lVar18);
            fVar166 = *pfVar1;
            fVar160 = pfVar1[1];
            fVar142 = pfVar1[2];
            pfVar1 = (float *)(pcVar6 + sVar26 * uVar14);
            fVar148 = *pfVar1;
            fVar150 = pfVar1[1];
            fVar153 = pfVar1[2];
            fVar84 = (fVar92 * 0.5 + fVar141 * 0.0 + fVar122 * 0.0) - fVar83 * 0.5;
            fVar91 = (fVar94 * 0.5 + fVar147 * 0.0 + fVar123 * 0.0) - fVar173 * 0.5;
            fVar93 = (fVar117 * 0.5 + fVar149 * 0.0 + fVar65 * 0.0) - fVar174 * 0.5;
            fVar95 = (fVar116 * 0.5 + fVar151 * 0.0 + fVar115 * 0.0) - fVar66 * 0.5;
            local_328.lower = auVar125._0_4_;
            local_328.upper = auVar125._4_4_;
            fStack_320 = auVar125._8_4_;
            fVar152 = (fVar166 * 0.5 + fVar148 * 0.0 + fVar130 * 0.0) - local_328.lower * 0.5;
            fVar157 = (fVar160 * 0.5 + fVar150 * 0.0 + fVar137 * 0.0) - local_328.upper * 0.5;
            fVar158 = (fVar142 * 0.5 + fVar153 * 0.0 + fVar124 * 0.0) - fStack_320 * 0.5;
            fVar96 = fVar92 * 0.0 + fVar141 * -0.0 + fVar122 + fVar83 * -0.0;
            fVar106 = fVar94 * 0.0 + fVar147 * -0.0 + fVar123 + fVar173 * -0.0;
            fVar109 = fVar117 * 0.0 + fVar149 * -0.0 + fVar65 + fVar174 * -0.0;
            fVar112 = fVar116 * 0.0 + fVar151 * -0.0 + fVar115 + fVar66 * -0.0;
            fVar159 = fVar166 * 0.0 + fVar148 * -0.0 + fVar130 + local_328.lower * -0.0;
            fVar163 = fVar160 * 0.0 + fVar150 * -0.0 + fVar137 + local_328.upper * -0.0;
            fVar165 = fVar142 * 0.0 + fVar153 * -0.0 + fVar124 + fStack_320 * -0.0;
            fVar97 = fVar141 * -0.0 + fVar92 + fVar122 * 0.0 + fVar83 * -0.0;
            fVar107 = fVar147 * -0.0 + fVar94 + fVar123 * 0.0 + fVar173 * -0.0;
            fVar110 = fVar149 * -0.0 + fVar117 + fVar65 * 0.0 + fVar174 * -0.0;
            fVar113 = fVar151 * -0.0 + fVar116 + fVar115 * 0.0 + fVar66 * -0.0;
            fVar131 = fVar83 * 0.0 + ((fVar141 * 0.5 + fVar92 * 0.0) - fVar122 * 0.5);
            fVar138 = fVar173 * 0.0 + ((fVar147 * 0.5 + fVar94 * 0.0) - fVar123 * 0.5);
            fVar139 = fVar174 * 0.0 + ((fVar149 * 0.5 + fVar117 * 0.0) - fVar65 * 0.5);
            fVar140 = fVar66 * 0.0 + ((fVar151 * 0.5 + fVar116 * 0.0) - fVar115 * 0.5);
            fVar174 = fVar148 * -0.0 + fVar166 + fVar130 * 0.0 + local_328.lower * -0.0;
            fVar122 = fVar150 * -0.0 + fVar160 + fVar137 * 0.0 + local_328.upper * -0.0;
            fVar123 = fVar153 * -0.0 + fVar142 + fVar124 * 0.0 + fStack_320 * -0.0;
            fVar66 = local_328.lower * 0.0 + ((fVar148 * 0.5 + fVar166 * 0.0) - fVar130 * 0.5);
            fVar83 = local_328.upper * 0.0 + ((fVar150 * 0.5 + fVar160 * 0.0) - fVar137 * 0.5);
            fVar173 = fStack_320 * 0.0 + ((fVar153 * 0.5 + fVar142 * 0.0) - fVar124 * 0.5);
            fVar160 = fVar159 * fVar91 - fVar163 * fVar84;
            fVar137 = fVar163 * fVar93 - fVar165 * fVar91;
            fVar166 = fVar165 * fVar84 - fVar159 * fVar93;
            fVar115 = fVar91 * fVar152 - fVar157 * fVar84;
            fVar92 = fVar93 * fVar157 - fVar158 * fVar91;
            fVar94 = fVar84 * fVar158 - fVar152 * fVar93;
            fVar117 = fVar174 * fVar138 - fVar122 * fVar131;
            fVar141 = fVar122 * fVar139 - fVar123 * fVar138;
            fVar149 = fVar123 * fVar131 - fVar174 * fVar139;
            fVar174 = fVar138 * fVar66 - fVar83 * fVar131;
            fVar123 = fVar139 * fVar83 - fVar173 * fVar138;
            fVar65 = fVar131 * fVar173 - fVar66 * fVar139;
            fVar83 = fVar166 * fVar166 + fVar137 * fVar137 + fVar160 * fVar160;
            auVar61 = ZEXT416((uint)fVar83);
            auVar46 = rsqrtss(ZEXT416((uint)fVar83),auVar61);
            fVar66 = auVar46._0_4_;
            fVar173 = fVar66 * 1.5 - fVar66 * fVar66 * fVar83 * 0.5 * fVar66;
            fVar152 = fVar160 * fVar115 + fVar166 * fVar94 + fVar137 * fVar92;
            auVar46 = rcpss(auVar61,auVar61);
            fVar66 = (2.0 - fVar83 * auVar46._0_4_) * auVar46._0_4_;
            fVar130 = fVar149 * fVar149 + fVar141 * fVar141 + fVar117 * fVar117;
            auVar46 = ZEXT416((uint)fVar130);
            auVar61 = rsqrtss(ZEXT416((uint)fVar130),auVar46);
            fVar122 = auVar61._0_4_;
            fVar116 = fVar122 * 1.5 - fVar122 * fVar122 * fVar130 * 0.5 * fVar122;
            fVar153 = fVar117 * fVar174 + fVar149 * fVar65 + fVar141 * fVar123;
            auVar46 = rcpss(auVar46,auVar46);
            fVar122 = (2.0 - fVar130 * auVar46._0_4_) * auVar46._0_4_;
            fVar151 = fVar112 * fVar137 * fVar173;
            fVar147 = fVar112 * fVar166 * fVar173;
            fVar124 = fVar112 * fVar160 * fVar173;
            fVar142 = fVar96 - fVar151;
            fVar148 = fVar106 - fVar147;
            fVar150 = fVar109 - fVar124;
            fVar137 = fVar112 * fVar66 * (fVar83 * fVar92 - fVar152 * fVar137) * fVar173 +
                      fVar95 * fVar137 * fVar173;
            fVar166 = fVar112 * fVar66 * (fVar83 * fVar94 - fVar152 * fVar166) * fVar173 +
                      fVar95 * fVar166 * fVar173;
            fVar160 = fVar112 * fVar66 * (fVar83 * fVar115 - fVar152 * fVar160) * fVar173 +
                      fVar95 * fVar160 * fVar173;
            fVar66 = fVar113 * fVar141 * fVar116;
            fVar83 = fVar113 * fVar149 * fVar116;
            fVar173 = fVar113 * fVar117 * fVar116;
            fVar95 = fVar97 - fVar66;
            fVar112 = fVar107 - fVar83;
            fVar152 = fVar110 - fVar173;
            fVar115 = fVar113 * fVar122 * (fVar130 * fVar123 - fVar153 * fVar141) * fVar116 +
                      fVar140 * fVar141 * fVar116;
            fVar65 = fVar113 * fVar122 * (fVar130 * fVar65 - fVar153 * fVar149) * fVar116 +
                     fVar140 * fVar149 * fVar116;
            fVar92 = fVar113 * fVar122 * (fVar130 * fVar174 - fVar153 * fVar117) * fVar116 +
                     fVar140 * fVar117 * fVar116;
            fVar94 = (fVar84 - fVar137) * 0.33333334 + fVar142;
            fVar117 = (fVar91 - fVar166) * 0.33333334 + fVar148;
            fVar116 = (fVar93 - fVar160) * 0.33333334 + fVar150;
            fVar174 = fVar95 - (fVar131 - fVar115) * 0.33333334;
            fVar122 = fVar112 - (fVar138 - fVar65) * 0.33333334;
            fVar123 = fVar152 - (fVar139 - fVar92) * 0.33333334;
            lVar16 = 0;
            aVar32 = _DAT_01f7a9f0;
            aVar119 = _DAT_01f7a9f0;
            aVar144 = _DAT_01f7aa00;
            aVar170 = _DAT_01f7aa00;
            aVar172 = _DAT_01f7aa00;
            aVar177 = _DAT_01f7a9f0;
            bVar27 = true;
            do {
              bVar21 = bVar27;
              iVar24 = (int)lVar16;
              lVar22 = lVar16 * 4;
              fVar141 = *(float *)(bezier_basis0 + lVar22 + 0x1dc);
              fVar149 = *(float *)(bezier_basis0 + lVar22 + 0x1e0);
              fVar130 = *(float *)(bezier_basis0 + lVar22 + 0x1e4);
              fVar153 = *(float *)(bezier_basis0 + lVar22 + 0x1e8);
              lVar22 = lVar16 * 4;
              fVar113 = *(float *)(bezier_basis0 + lVar22 + 0x660);
              fVar140 = *(float *)(bezier_basis0 + lVar22 + 0x664);
              fVar157 = *(float *)(bezier_basis0 + lVar22 + 0x668);
              fVar158 = *(float *)(bezier_basis0 + lVar22 + 0x66c);
              lVar22 = lVar16 * 4;
              fVar159 = *(float *)(bezier_basis0 + lVar22 + 0xae4);
              fVar163 = *(float *)(bezier_basis0 + lVar22 + 0xae8);
              fVar165 = *(float *)(bezier_basis0 + lVar22 + 0xaec);
              fVar8 = *(float *)(bezier_basis0 + lVar22 + 0xaf0);
              lVar22 = lVar16 * 4;
              fVar9 = *(float *)(bezier_basis0 + lVar22 + 0xf68);
              fVar10 = *(float *)(bezier_basis0 + lVar22 + 0xf6c);
              fVar11 = *(float *)(bezier_basis0 + lVar22 + 0xf70);
              fVar12 = *(float *)(bezier_basis0 + lVar22 + 0xf74);
              auVar133._0_4_ =
                   fVar142 * fVar141 + fVar94 * fVar113 + fVar174 * fVar159 + fVar95 * fVar9;
              auVar133._4_4_ =
                   fVar142 * fVar149 + fVar94 * fVar140 + fVar174 * fVar163 + fVar95 * fVar10;
              auVar133._8_4_ =
                   fVar142 * fVar130 + fVar94 * fVar157 + fVar174 * fVar165 + fVar95 * fVar11;
              auVar133._12_4_ =
                   fVar142 * fVar153 + fVar94 * fVar158 + fVar174 * fVar8 + fVar95 * fVar12;
              auVar126._0_4_ =
                   fVar148 * fVar141 + fVar117 * fVar113 + fVar122 * fVar159 + fVar112 * fVar9;
              auVar126._4_4_ =
                   fVar148 * fVar149 + fVar117 * fVar140 + fVar122 * fVar163 + fVar112 * fVar10;
              auVar126._8_4_ =
                   fVar148 * fVar130 + fVar117 * fVar157 + fVar122 * fVar165 + fVar112 * fVar11;
              auVar126._12_4_ =
                   fVar148 * fVar153 + fVar117 * fVar158 + fVar122 * fVar8 + fVar112 * fVar12;
              auVar85._0_4_ =
                   fVar141 * fVar150 + fVar113 * fVar116 + fVar159 * fVar123 + fVar9 * fVar152;
              auVar85._4_4_ =
                   fVar149 * fVar150 + fVar140 * fVar116 + fVar163 * fVar123 + fVar10 * fVar152;
              auVar85._8_4_ =
                   fVar130 * fVar150 + fVar157 * fVar116 + fVar165 * fVar123 + fVar11 * fVar152;
              auVar85._12_4_ =
                   fVar153 * fVar150 + fVar158 * fVar116 + fVar8 * fVar123 + fVar12 * fVar152;
              lVar22 = lVar16 * 4;
              fVar141 = *(float *)(bezier_basis0 + lVar22 + 0x13ec);
              fVar149 = *(float *)(bezier_basis0 + lVar22 + 0x13f0);
              fVar130 = *(float *)(bezier_basis0 + lVar22 + 0x13f4);
              fVar153 = *(float *)(bezier_basis0 + lVar22 + 0x13f8);
              lVar22 = lVar16 * 4;
              fVar113 = *(float *)(bezier_basis0 + lVar22 + 0x1cf4);
              fVar140 = *(float *)(bezier_basis0 + lVar22 + 0x1cf8);
              fVar157 = *(float *)(bezier_basis0 + lVar22 + 0x1cfc);
              fVar158 = *(float *)(bezier_basis0 + lVar22 + 0x1d00);
              lVar22 = lVar16 * 4;
              fVar159 = *(float *)(bezier_basis0 + lVar22 + 0x2178);
              fVar163 = *(float *)(bezier_basis0 + lVar22 + 0x217c);
              fVar165 = *(float *)(bezier_basis0 + lVar22 + 0x2180);
              fVar8 = *(float *)(bezier_basis0 + lVar22 + 0x2184);
              lVar16 = lVar16 * 4;
              fVar9 = *(float *)(bezier_basis0 + lVar16 + 0x1870);
              fVar10 = *(float *)(bezier_basis0 + lVar16 + 0x1874);
              fVar11 = *(float *)(bezier_basis0 + lVar16 + 0x1878);
              fVar12 = *(float *)(bezier_basis0 + lVar16 + 0x187c);
              fVar67 = fVar142 * fVar141 + fVar94 * fVar9 + fVar174 * fVar113 + fVar95 * fVar159;
              fVar80 = fVar142 * fVar149 + fVar94 * fVar10 + fVar174 * fVar140 + fVar95 * fVar163;
              fVar81 = fVar142 * fVar130 + fVar94 * fVar11 + fVar174 * fVar157 + fVar95 * fVar165;
              fVar82 = fVar142 * fVar153 + fVar94 * fVar12 + fVar174 * fVar158 + fVar95 * fVar8;
              fVar98 = fVar148 * fVar141 + fVar117 * fVar9 + fVar122 * fVar113 + fVar112 * fVar159;
              fVar108 = fVar148 * fVar149 + fVar117 * fVar10 + fVar122 * fVar140 + fVar112 * fVar163
              ;
              fVar111 = fVar148 * fVar130 + fVar117 * fVar11 + fVar122 * fVar157 + fVar112 * fVar165
              ;
              fVar114 = fVar148 * fVar153 + fVar117 * fVar12 + fVar122 * fVar158 + fVar112 * fVar8;
              fVar141 = fVar141 * fVar150 + fVar9 * fVar116 + fVar113 * fVar123 + fVar159 * fVar152;
              fVar149 = fVar149 * fVar150 + fVar10 * fVar116 + fVar140 * fVar123 + fVar163 * fVar152
              ;
              fVar130 = fVar130 * fVar150 + fVar11 * fVar116 + fVar157 * fVar123 + fVar165 * fVar152
              ;
              fVar153 = fVar153 * fVar150 + fVar12 * fVar116 + fVar158 * fVar123 + fVar8 * fVar152;
              uVar179 = -(uint)(iVar24 == 0);
              uVar180 = -(uint)(iVar24 == 1);
              uVar181 = -(uint)(iVar24 == 2);
              uVar182 = -(uint)(iVar24 == 3);
              uVar63 = -(uint)(iVar24 == 7);
              uVar164 = -(uint)(iVar24 == 6);
              uVar167 = -(uint)(iVar24 == 5);
              uVar168 = -(uint)(iVar24 == 4);
              auVar154._0_4_ = (float)(~uVar63 & (uint)fVar67) * 0.055555556 + auVar133._0_4_;
              auVar154._4_4_ = (float)(~uVar164 & (uint)fVar80) * 0.055555556 + auVar133._4_4_;
              auVar154._8_4_ = (float)(~uVar167 & (uint)fVar81) * 0.055555556 + auVar133._8_4_;
              auVar154._12_4_ = (float)(~uVar168 & (uint)fVar82) * 0.055555556 + auVar133._12_4_;
              auVar118 = minps((undefined1  [16])aVar119,auVar133);
              auVar171 = maxps((undefined1  [16])aVar172,auVar133);
              auVar134._0_8_ =
                   CONCAT44(auVar133._4_4_ - (float)(~uVar180 & (uint)fVar80) * 0.055555556,
                            auVar133._0_4_ - (float)(~uVar179 & (uint)fVar67) * 0.055555556);
              auVar134._8_4_ = auVar133._8_4_ - (float)(~uVar181 & (uint)fVar81) * 0.055555556;
              auVar134._12_4_ = auVar133._12_4_ - (float)(~uVar182 & (uint)fVar82) * 0.055555556;
              auVar178._0_4_ = (float)(~uVar63 & (uint)fVar98) * 0.055555556 + auVar126._0_4_;
              auVar178._4_4_ = (float)(~uVar164 & (uint)fVar108) * 0.055555556 + auVar126._4_4_;
              auVar178._8_4_ = (float)(~uVar167 & (uint)fVar111) * 0.055555556 + auVar126._8_4_;
              auVar178._12_4_ = (float)(~uVar168 & (uint)fVar114) * 0.055555556 + auVar126._12_4_;
              auVar46 = minps((undefined1  [16])aVar32,auVar126);
              auVar169 = maxps((undefined1  [16])aVar170,auVar126);
              auVar127._0_8_ =
                   CONCAT44(auVar126._4_4_ - (float)(~uVar180 & (uint)fVar108) * 0.055555556,
                            auVar126._0_4_ - (float)(~uVar179 & (uint)fVar98) * 0.055555556);
              auVar127._8_4_ = auVar126._8_4_ - (float)(~uVar181 & (uint)fVar111) * 0.055555556;
              auVar127._12_4_ = auVar126._12_4_ - (float)(~uVar182 & (uint)fVar114) * 0.055555556;
              auVar161._0_4_ = (float)(~uVar63 & (uint)fVar141) * 0.055555556 + auVar85._0_4_;
              auVar161._4_4_ = (float)(~uVar164 & (uint)fVar149) * 0.055555556 + auVar85._4_4_;
              auVar161._8_4_ = (float)(~uVar167 & (uint)fVar130) * 0.055555556 + auVar85._8_4_;
              auVar161._12_4_ = (float)(~uVar168 & (uint)fVar153) * 0.055555556 + auVar85._12_4_;
              auVar176 = minps((undefined1  [16])aVar177,auVar85);
              auVar143 = maxps((undefined1  [16])aVar144,auVar85);
              auVar86._0_8_ =
                   CONCAT44(auVar85._4_4_ - (float)(~uVar180 & (uint)fVar149) * 0.055555556,
                            auVar85._0_4_ - (float)(~uVar179 & (uint)fVar141) * 0.055555556);
              auVar86._8_4_ = auVar85._8_4_ - (float)(~uVar181 & (uint)fVar130) * 0.055555556;
              auVar86._12_4_ = auVar85._12_4_ - (float)(~uVar182 & (uint)fVar153) * 0.055555556;
              auVar68._8_4_ = auVar134._8_4_;
              auVar68._0_8_ = auVar134._0_8_;
              auVar68._12_4_ = auVar134._12_4_;
              auVar61 = minps(auVar68,auVar154);
              aVar119 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar118,auVar61);
              auVar69._8_4_ = auVar127._8_4_;
              auVar69._0_8_ = auVar127._0_8_;
              auVar69._12_4_ = auVar127._12_4_;
              auVar61 = minps(auVar69,auVar178);
              aVar32 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar46,auVar61);
              auVar70._8_4_ = auVar86._8_4_;
              auVar70._0_8_ = auVar86._0_8_;
              auVar70._12_4_ = auVar86._12_4_;
              auVar46 = minps(auVar70,auVar161);
              aVar177 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar176,auVar46);
              auVar46 = maxps(auVar134,auVar154);
              aVar172 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar171,auVar46);
              auVar46 = maxps(auVar127,auVar178);
              aVar170 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar169,auVar46);
              auVar46 = maxps(auVar86,auVar161);
              aVar144 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar143,auVar46);
              lVar16 = 4;
              bVar27 = false;
            } while (bVar21);
            fVar96 = fVar96 + fVar151;
            fVar106 = fVar106 + fVar147;
            fVar109 = fVar109 + fVar124;
            fVar97 = fVar97 + fVar66;
            fVar107 = fVar107 + fVar83;
            fVar110 = fVar110 + fVar173;
            fVar174 = (fVar137 + fVar84) * 0.33333334 + fVar96;
            fVar122 = (fVar166 + fVar91) * 0.33333334 + fVar106;
            fVar123 = (fVar160 + fVar93) * 0.33333334 + fVar109;
            fVar66 = fVar97 - (fVar115 + fVar131) * 0.33333334;
            fVar83 = fVar107 - (fVar65 + fVar138) * 0.33333334;
            fVar173 = fVar110 - (fVar92 + fVar139) * 0.33333334;
            auVar52._4_4_ = aVar119.m128[0];
            auVar52._0_4_ = aVar119.m128[1];
            auVar52._8_4_ = aVar119.m128[3];
            auVar52._12_4_ = aVar119.m128[2];
            auVar46 = minps(auVar52,(undefined1  [16])aVar119);
            auVar71._0_8_ = auVar46._8_8_;
            auVar71._8_4_ = auVar46._0_4_;
            auVar71._12_4_ = auVar46._4_4_;
            auVar61 = minps(auVar71,auVar46);
            auVar53._4_4_ = aVar32.m128[0];
            auVar53._0_4_ = aVar32.m128[1];
            auVar53._8_4_ = aVar32.m128[3];
            auVar53._12_4_ = aVar32.m128[2];
            auVar46 = minps(auVar53,(undefined1  [16])aVar32);
            auVar87._0_8_ = auVar46._8_8_;
            auVar87._8_4_ = auVar46._0_4_;
            auVar87._12_4_ = auVar46._4_4_;
            auVar118 = minps(auVar87,auVar46);
            auVar33._4_4_ = aVar177.m128[0];
            auVar33._0_4_ = aVar177.m128[1];
            auVar33._8_4_ = aVar177.m128[3];
            auVar33._12_4_ = aVar177.m128[2];
            auVar46 = minps(auVar33,(undefined1  [16])aVar177);
            auVar34._0_8_ = auVar46._8_8_;
            auVar34._8_4_ = auVar46._0_4_;
            auVar34._12_4_ = auVar46._4_4_;
            auVar90._4_4_ = auVar118._0_4_;
            auVar90._0_4_ = auVar61._0_4_;
            auVar35._4_4_ = aVar172.m128[0];
            auVar35._0_4_ = aVar172.m128[1];
            auVar35._8_4_ = aVar172.m128[3];
            auVar35._12_4_ = aVar172.m128[2];
            auVar61 = maxps(auVar35,(undefined1  [16])aVar172);
            auVar54._0_8_ = auVar61._8_8_;
            auVar54._8_4_ = auVar61._0_4_;
            auVar54._12_4_ = auVar61._4_4_;
            auVar118 = maxps(auVar54,auVar61);
            auVar36._4_4_ = aVar170.m128[0];
            auVar36._0_4_ = aVar170.m128[1];
            auVar36._8_4_ = aVar170.m128[3];
            auVar36._12_4_ = aVar170.m128[2];
            auVar61 = maxps(auVar36,(undefined1  [16])aVar170);
            auVar72._0_8_ = auVar61._8_8_;
            auVar72._8_4_ = auVar61._0_4_;
            auVar72._12_4_ = auVar61._4_4_;
            auVar61 = maxps(auVar72,auVar61);
            auVar37._4_4_ = aVar144.m128[0];
            auVar37._0_4_ = aVar144.m128[1];
            auVar37._8_4_ = aVar144.m128[3];
            auVar37._12_4_ = aVar144.m128[2];
            local_a8 = maxps(auVar37,(undefined1  [16])aVar144);
            local_b8._0_8_ = local_a8._8_8_;
            local_b8._8_4_ = local_a8._0_4_;
            local_b8._12_4_ = local_a8._4_4_;
            auVar103._4_4_ = auVar61._0_4_;
            auVar103._0_4_ = auVar118._0_4_;
            lVar16 = 0;
            local_318 = _DAT_01f7aa00;
            aVar32 = _DAT_01f7aa00;
            aVar119 = _DAT_01f7a9f0;
            aVar144 = _DAT_01f7a9f0;
            aVar170 = _DAT_01f7aa00;
            aVar172 = _DAT_01f7a9f0;
            bVar27 = true;
            do {
              bVar21 = bVar27;
              iVar24 = (int)lVar16;
              lVar22 = lVar16 * 4;
              fVar65 = *(float *)(bezier_basis0 + lVar22 + 0x1dc);
              fVar115 = *(float *)(bezier_basis0 + lVar22 + 0x1e0);
              fVar92 = *(float *)(bezier_basis0 + lVar22 + 0x1e4);
              fVar94 = *(float *)(bezier_basis0 + lVar22 + 0x1e8);
              lVar22 = lVar16 * 4;
              fVar117 = *(float *)(bezier_basis0 + lVar22 + 0x660);
              fVar116 = *(float *)(bezier_basis0 + lVar22 + 0x664);
              fVar151 = *(float *)(bezier_basis0 + lVar22 + 0x668);
              fVar141 = *(float *)(bezier_basis0 + lVar22 + 0x66c);
              lVar22 = lVar16 * 4;
              fVar147 = *(float *)(bezier_basis0 + lVar22 + 0xae4);
              fVar149 = *(float *)(bezier_basis0 + lVar22 + 0xae8);
              fVar124 = *(float *)(bezier_basis0 + lVar22 + 0xaec);
              fVar130 = *(float *)(bezier_basis0 + lVar22 + 0xaf0);
              lVar22 = lVar16 * 4;
              fVar137 = *(float *)(bezier_basis0 + lVar22 + 0xf68);
              fVar166 = *(float *)(bezier_basis0 + lVar22 + 0xf6c);
              fVar160 = *(float *)(bezier_basis0 + lVar22 + 0xf70);
              fVar142 = *(float *)(bezier_basis0 + lVar22 + 0xf74);
              auVar88._0_4_ =
                   fVar96 * fVar65 + fVar174 * fVar117 + fVar66 * fVar147 + fVar97 * fVar137;
              auVar88._4_4_ =
                   fVar96 * fVar115 + fVar174 * fVar116 + fVar66 * fVar149 + fVar97 * fVar166;
              auVar88._8_4_ =
                   fVar96 * fVar92 + fVar174 * fVar151 + fVar66 * fVar124 + fVar97 * fVar160;
              auVar88._12_4_ =
                   fVar96 * fVar94 + fVar174 * fVar141 + fVar66 * fVar130 + fVar97 * fVar142;
              auVar73._0_4_ =
                   fVar106 * fVar65 + fVar122 * fVar117 + fVar83 * fVar147 + fVar107 * fVar137;
              auVar73._4_4_ =
                   fVar106 * fVar115 + fVar122 * fVar116 + fVar83 * fVar149 + fVar107 * fVar166;
              auVar73._8_4_ =
                   fVar106 * fVar92 + fVar122 * fVar151 + fVar83 * fVar124 + fVar107 * fVar160;
              auVar73._12_4_ =
                   fVar106 * fVar94 + fVar122 * fVar141 + fVar83 * fVar130 + fVar107 * fVar142;
              auVar145._0_4_ =
                   fVar65 * fVar109 + fVar117 * fVar123 + fVar147 * fVar173 + fVar137 * fVar110;
              auVar145._4_4_ =
                   fVar115 * fVar109 + fVar116 * fVar123 + fVar149 * fVar173 + fVar166 * fVar110;
              auVar145._8_4_ =
                   fVar92 * fVar109 + fVar151 * fVar123 + fVar124 * fVar173 + fVar160 * fVar110;
              auVar145._12_4_ =
                   fVar94 * fVar109 + fVar141 * fVar123 + fVar130 * fVar173 + fVar142 * fVar110;
              lVar22 = lVar16 * 4;
              fVar65 = *(float *)(bezier_basis0 + lVar22 + 0x13ec);
              fVar115 = *(float *)(bezier_basis0 + lVar22 + 0x13f0);
              fVar92 = *(float *)(bezier_basis0 + lVar22 + 0x13f4);
              fVar94 = *(float *)(bezier_basis0 + lVar22 + 0x13f8);
              lVar22 = lVar16 * 4;
              fVar117 = *(float *)(bezier_basis0 + lVar22 + 0x1cf4);
              fVar116 = *(float *)(bezier_basis0 + lVar22 + 0x1cf8);
              fVar151 = *(float *)(bezier_basis0 + lVar22 + 0x1cfc);
              fVar141 = *(float *)(bezier_basis0 + lVar22 + 0x1d00);
              lVar22 = lVar16 * 4;
              fVar147 = *(float *)(bezier_basis0 + lVar22 + 0x2178);
              fVar149 = *(float *)(bezier_basis0 + lVar22 + 0x217c);
              fVar124 = *(float *)(bezier_basis0 + lVar22 + 0x2180);
              fVar130 = *(float *)(bezier_basis0 + lVar22 + 0x2184);
              lVar16 = lVar16 * 4;
              fVar137 = *(float *)(bezier_basis0 + lVar16 + 0x1870);
              fVar166 = *(float *)(bezier_basis0 + lVar16 + 0x1874);
              fVar160 = *(float *)(bezier_basis0 + lVar16 + 0x1878);
              fVar142 = *(float *)(bezier_basis0 + lVar16 + 0x187c);
              fVar148 = fVar96 * fVar65 + fVar174 * fVar137 + fVar66 * fVar117 + fVar97 * fVar147;
              fVar150 = fVar96 * fVar115 + fVar174 * fVar166 + fVar66 * fVar116 + fVar97 * fVar149;
              fVar153 = fVar96 * fVar92 + fVar174 * fVar160 + fVar66 * fVar151 + fVar97 * fVar124;
              fVar84 = fVar96 * fVar94 + fVar174 * fVar142 + fVar66 * fVar141 + fVar97 * fVar130;
              fVar91 = fVar106 * fVar65 + fVar122 * fVar137 + fVar83 * fVar117 + fVar107 * fVar147;
              fVar93 = fVar106 * fVar115 + fVar122 * fVar166 + fVar83 * fVar116 + fVar107 * fVar149;
              fVar95 = fVar106 * fVar92 + fVar122 * fVar160 + fVar83 * fVar151 + fVar107 * fVar124;
              fVar112 = fVar106 * fVar94 + fVar122 * fVar142 + fVar83 * fVar141 + fVar107 * fVar130;
              fVar65 = fVar65 * fVar109 + fVar137 * fVar123 + fVar117 * fVar173 + fVar147 * fVar110;
              fVar115 = fVar115 * fVar109 +
                        fVar166 * fVar123 + fVar116 * fVar173 + fVar149 * fVar110;
              fVar92 = fVar92 * fVar109 + fVar160 * fVar123 + fVar151 * fVar173 + fVar124 * fVar110;
              fVar94 = fVar94 * fVar109 + fVar142 * fVar123 + fVar141 * fVar173 + fVar130 * fVar110;
              uVar179 = -(uint)(iVar24 == 0);
              uVar180 = -(uint)(iVar24 == 1);
              uVar181 = -(uint)(iVar24 == 2);
              uVar182 = -(uint)(iVar24 == 3);
              uVar63 = -(uint)(iVar24 == 7);
              uVar164 = -(uint)(iVar24 == 6);
              uVar167 = -(uint)(iVar24 == 5);
              uVar168 = -(uint)(iVar24 == 4);
              auVar38._0_4_ = (float)(~uVar63 & (uint)fVar148) * 0.055555556 + auVar88._0_4_;
              auVar38._4_4_ = (float)(~uVar164 & (uint)fVar150) * 0.055555556 + auVar88._4_4_;
              auVar38._8_4_ = (float)(~uVar167 & (uint)fVar153) * 0.055555556 + auVar88._8_4_;
              auVar38._12_4_ = (float)(~uVar168 & (uint)fVar84) * 0.055555556 + auVar88._12_4_;
              auVar171 = minps((undefined1  [16])aVar144,auVar88);
              auVar176 = maxps((undefined1  [16])aVar170,auVar88);
              auVar155._0_8_ =
                   CONCAT44(auVar88._4_4_ - (float)(~uVar180 & (uint)fVar150) * 0.055555556,
                            auVar88._0_4_ - (float)(~uVar179 & (uint)fVar148) * 0.055555556);
              auVar155._8_4_ = auVar88._8_4_ - (float)(~uVar181 & (uint)fVar153) * 0.055555556;
              auVar155._12_4_ = auVar88._12_4_ - (float)(~uVar182 & (uint)fVar84) * 0.055555556;
              auVar89._0_4_ = (float)(~uVar63 & (uint)fVar91) * 0.055555556 + auVar73._0_4_;
              auVar89._4_4_ = (float)(~uVar164 & (uint)fVar93) * 0.055555556 + auVar73._4_4_;
              auVar89._8_4_ = (float)(~uVar167 & (uint)fVar95) * 0.055555556 + auVar73._8_4_;
              auVar89._12_4_ = (float)(~uVar168 & (uint)fVar112) * 0.055555556 + auVar73._12_4_;
              auVar178 = minps((undefined1  [16])aVar172,auVar73);
              auVar143 = maxps((undefined1  [16])local_318,auVar73);
              auVar74._0_8_ =
                   CONCAT44(auVar73._4_4_ - (float)(~uVar180 & (uint)fVar93) * 0.055555556,
                            auVar73._0_4_ - (float)(~uVar179 & (uint)fVar91) * 0.055555556);
              auVar74._8_4_ = auVar73._8_4_ - (float)(~uVar181 & (uint)fVar95) * 0.055555556;
              auVar74._12_4_ = auVar73._12_4_ - (float)(~uVar182 & (uint)fVar112) * 0.055555556;
              auVar55._0_4_ = (float)(~uVar63 & (uint)fVar65) * 0.055555556 + auVar145._0_4_;
              auVar55._4_4_ = (float)(~uVar164 & (uint)fVar115) * 0.055555556 + auVar145._4_4_;
              auVar55._8_4_ = (float)(~uVar167 & (uint)fVar92) * 0.055555556 + auVar145._8_4_;
              auVar55._12_4_ = (float)(~uVar168 & (uint)fVar94) * 0.055555556 + auVar145._12_4_;
              auVar169 = minps((undefined1  [16])aVar119,auVar145);
              auVar118 = maxps((undefined1  [16])aVar32,auVar145);
              auVar146._0_8_ =
                   CONCAT44(auVar145._4_4_ - (float)(~uVar180 & (uint)fVar115) * 0.055555556,
                            auVar145._0_4_ - (float)(~uVar179 & (uint)fVar65) * 0.055555556);
              auVar146._8_4_ = auVar145._8_4_ - (float)(~uVar181 & (uint)fVar92) * 0.055555556;
              auVar146._12_4_ = auVar145._12_4_ - (float)(~uVar182 & (uint)fVar94) * 0.055555556;
              auVar100._8_4_ = auVar155._8_4_;
              auVar100._0_8_ = auVar155._0_8_;
              auVar100._12_4_ = auVar155._12_4_;
              auVar61 = minps(auVar100,auVar38);
              aVar144 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar171,auVar61);
              auVar101._8_4_ = auVar74._8_4_;
              auVar101._0_8_ = auVar74._0_8_;
              auVar101._12_4_ = auVar74._12_4_;
              auVar61 = minps(auVar101,auVar89);
              aVar172 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar178,auVar61);
              auVar102._8_4_ = auVar146._8_4_;
              auVar102._0_8_ = auVar146._0_8_;
              auVar102._12_4_ = auVar146._12_4_;
              auVar61 = minps(auVar102,auVar55);
              aVar119 = (anon_union_16_2_47237d3f_for_Vec3fa_0)minps(auVar169,auVar61);
              auVar61 = maxps(auVar155,auVar38);
              aVar170 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar176,auVar61);
              auVar61 = maxps(auVar74,auVar89);
              local_318 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar143,auVar61);
              auVar61 = maxps(auVar146,auVar55);
              aVar32 = (anon_union_16_2_47237d3f_for_Vec3fa_0)maxps(auVar118,auVar61);
              lVar16 = 4;
              bVar27 = false;
            } while (bVar21);
            auVar46 = minps(auVar34,auVar46);
            auVar90._8_4_ = auVar46._0_4_;
            auVar90._12_4_ = 0;
            auVar46 = maxps(local_b8,local_a8);
            auVar103._8_4_ = auVar46._0_4_;
            auVar103._12_4_ = 0;
            auVar39._4_4_ = aVar144.m128[0];
            auVar39._0_4_ = aVar144.m128[1];
            auVar39._8_4_ = aVar144.m128[3];
            auVar39._12_4_ = aVar144.m128[2];
            auVar46 = minps(auVar39,(undefined1  [16])aVar144);
            auVar56._0_8_ = auVar46._8_8_;
            auVar56._8_4_ = auVar46._0_4_;
            auVar56._12_4_ = auVar46._4_4_;
            auVar61 = minps(auVar56,auVar46);
            auVar40._4_4_ = aVar172.m128[0];
            auVar40._0_4_ = aVar172.m128[1];
            auVar40._8_4_ = aVar172.m128[3];
            auVar40._12_4_ = aVar172.m128[2];
            auVar46 = minps(auVar40,(undefined1  [16])aVar172);
            auVar75._0_8_ = auVar46._8_8_;
            auVar75._8_4_ = auVar46._0_4_;
            auVar75._12_4_ = auVar46._4_4_;
            auVar118 = minps(auVar75,auVar46);
            auVar41._4_4_ = aVar119.m128[0];
            auVar41._0_4_ = aVar119.m128[1];
            auVar41._8_4_ = aVar119.m128[3];
            auVar41._12_4_ = aVar119.m128[2];
            auVar46 = minps(auVar41,(undefined1  [16])aVar119);
            auVar57._0_8_ = auVar46._8_8_;
            auVar57._8_4_ = auVar46._0_4_;
            auVar57._12_4_ = auVar46._4_4_;
            auVar46 = minps(auVar57,auVar46);
            auVar76._4_4_ = auVar118._0_4_;
            auVar76._0_4_ = auVar61._0_4_;
            auVar76._8_4_ = auVar46._0_4_;
            auVar76._12_4_ = 0;
            auVar143 = minps(auVar90,auVar76);
            auVar42._4_4_ = aVar170.m128[0];
            auVar42._0_4_ = aVar170.m128[1];
            auVar42._8_4_ = aVar170.m128[3];
            auVar42._12_4_ = aVar170.m128[2];
            auVar46 = maxps(auVar42,(undefined1  [16])aVar170);
            auVar58._0_8_ = auVar46._8_8_;
            auVar58._8_4_ = auVar46._0_4_;
            auVar58._12_4_ = auVar46._4_4_;
            auVar61 = maxps(auVar58,auVar46);
            auVar43._4_4_ = local_318.m128[0];
            auVar43._0_4_ = local_318.m128[1];
            auVar43._8_4_ = local_318.m128[3];
            auVar43._12_4_ = local_318.m128[2];
            auVar46 = maxps(auVar43,(undefined1  [16])local_318);
            auVar77._0_8_ = auVar46._8_8_;
            auVar77._8_4_ = auVar46._0_4_;
            auVar77._12_4_ = auVar46._4_4_;
            auVar118 = maxps(auVar77,auVar46);
            auVar44._4_4_ = aVar32.m128[0];
            auVar44._0_4_ = aVar32.m128[1];
            auVar44._8_4_ = aVar32.m128[3];
            auVar44._12_4_ = aVar32.m128[2];
            auVar46 = maxps(auVar44,(undefined1  [16])aVar32);
            auVar59._0_8_ = auVar46._8_8_;
            auVar59._8_4_ = auVar46._0_4_;
            auVar59._12_4_ = auVar46._4_4_;
            auVar46 = maxps(auVar59,auVar46);
            auVar78._4_4_ = auVar118._0_4_;
            auVar78._0_4_ = auVar61._0_4_;
            auVar78._8_4_ = auVar46._0_4_;
            auVar78._12_4_ = 0;
            auVar46 = maxps(auVar103,auVar78);
            auVar104._0_4_ = -(uint)(auVar46._0_4_ < 1.844e+18 && -1.844e+18 < auVar143._0_4_);
            auVar104._4_4_ = -(uint)(auVar46._4_4_ < 1.844e+18 && -1.844e+18 < auVar143._4_4_);
            auVar104._8_4_ = -(uint)(auVar46._8_4_ < 1.844e+18 && -1.844e+18 < auVar143._8_4_);
            auVar104._12_4_ = -(uint)(auVar46._12_4_ < 1.844e+18 && -1.844e+18 < auVar143._12_4_);
            uVar19 = movmskps((int)lVar18,auVar104);
            if ((~(byte)uVar19 & 7) != 0) goto LAB_009dcdbe;
            uVar17 = uVar17 + 1;
          } while (uVar17 <= (ulong)(long)(int)fVar49);
          local_328 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                      super_CurveGeometry.super_Geometry.time_range;
        }
        local_108.primID = &local_110;
        fVar66 = (fVar30 - local_328.lower) / (local_328.upper - local_328.lower);
        fVar83 = (fVar29 - local_328.lower) / (local_328.upper - local_328.lower);
        fVar29 = fVar13 * fVar66;
        fVar28 = fVar13 * fVar83;
        local_110 = uVar15;
        local_108.this = this;
        fVar30 = floorf(fVar29);
        fVar49 = ceilf(fVar28);
        uVar23 = (uint)fVar30;
        if (fVar30 <= 0.0) {
          fVar30 = 0.0;
        }
        fVar173 = fVar49;
        if (fVar13 <= fVar49) {
          fVar173 = fVar13;
        }
        if ((int)uVar23 < 0) {
          uVar23 = 0xffffffff;
        }
        iVar24 = (int)fVar13 + 1;
        if ((int)fVar49 < (int)fVar13 + 1) {
          iVar24 = (int)fVar49;
        }
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_d8.field_1,&local_108,(long)(int)fVar30);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_f8.field_1,&local_108,(long)(int)fVar173);
        if (iVar24 - uVar23 == 1) {
          fVar13 = fVar29 - fVar30;
          if (fVar29 - fVar30 <= 0.0) {
            fVar13 = 0.0;
          }
          fVar30 = 1.0 - fVar13;
          auVar132._0_4_ = fVar30 * local_d8.m128[0] + fVar13 * local_f8.m128[0];
          auVar132._4_4_ = fVar30 * local_d8.m128[1] + fVar13 * local_f8.m128[1];
          auVar132._8_4_ = fVar30 * local_d8.m128[2] + fVar13 * local_f8.m128[2];
          auVar125._0_4_ = fVar30 * local_c8 + fVar13 * local_e8;
          auVar125._4_4_ = fVar30 * fStack_c4 + fVar13 * fStack_e4;
          auVar125._8_4_ = fVar30 * fStack_c0 + fVar13 * fStack_e0;
          fVar13 = fVar173 - fVar28;
          if (fVar173 - fVar28 <= 0.0) {
            fVar13 = 0.0;
          }
          fVar30 = 1.0 - fVar13;
          auVar31._0_4_ = local_f8.m128[0] * fVar30 + local_d8.m128[0] * fVar13;
          auVar31._4_4_ = local_f8.m128[1] * fVar30 + local_d8.m128[1] * fVar13;
          auVar31._8_4_ = local_f8.m128[2] * fVar30 + local_d8.m128[2] * fVar13;
          auVar51._0_4_ = fVar30 * local_e8 + fVar13 * local_c8;
          auVar51._4_4_ = fVar30 * fStack_e4 + fVar13 * fStack_c4;
          auVar51._8_4_ = fVar30 * fStack_e0 + fVar13 * fStack_c0;
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_108,(long)((int)fVar30 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_108,(long)((int)fVar173 + -1));
          fVar49 = fVar29 - fVar30;
          if (fVar29 - fVar30 <= 0.0) {
            fVar49 = 0.0;
          }
          fVar30 = 1.0 - fVar49;
          auVar132._0_4_ = local_d8.m128[0] * fVar30 + local_58.m128[0] * fVar49;
          auVar132._4_4_ = local_d8.m128[1] * fVar30 + local_58.m128[1] * fVar49;
          auVar132._8_4_ = local_d8.m128[2] * fVar30 + local_58.m128[2] * fVar49;
          auVar135._12_4_ = local_d8.m128[3] * fVar30 + local_58.m128[3] * fVar49;
          auVar135._0_12_ = auVar132;
          auVar125._0_4_ = fVar30 * local_c8 + fVar49 * local_48;
          auVar125._4_4_ = fVar30 * fStack_c4 + fVar49 * fStack_44;
          auVar125._8_4_ = fVar30 * fStack_c0 + fVar49 * fStack_40;
          auVar128._12_4_ = fVar30 * fStack_bc + fVar49 * fStack_3c;
          auVar128._0_12_ = auVar125;
          fVar30 = fVar173 - fVar28;
          if (fVar173 - fVar28 <= 0.0) {
            fVar30 = 0.0;
          }
          fVar29 = 1.0 - fVar30;
          auVar120._0_8_ =
               CONCAT44(local_f8.m128[1] * fVar29 + local_78.m128[1] * fVar30,
                        local_f8.m128[0] * fVar29 + local_78.m128[0] * fVar30);
          auVar120._8_4_ = local_f8.m128[2] * fVar29 + local_78.m128[2] * fVar30;
          auVar120._12_4_ = local_f8.m128[3] * fVar29 + local_78.m128[3] * fVar30;
          auVar105._0_8_ =
               CONCAT44(fVar29 * fStack_e4 + fVar30 * fStack_64,
                        fVar29 * local_e8 + fVar30 * local_68);
          auVar105._8_4_ = fVar29 * fStack_e0 + fVar30 * fStack_60;
          auVar105._12_4_ = fVar29 * fStack_dc + fVar30 * fStack_5c;
          if ((int)(uVar23 + 1) < iVar24) {
            sVar26 = (size_t)(uVar23 + 1);
            iVar24 = ~uVar23 + iVar24;
            do {
              fVar30 = ((float)(int)sVar26 / fVar13 - fVar66) / (fVar83 - fVar66);
              fVar49 = 1.0 - fVar30;
              fVar29 = auVar120._12_4_;
              fVar28 = auVar105._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_108,sVar26);
              auVar45._0_4_ = local_98.m128[0] - (auVar135._0_4_ * fVar49 + auVar120._0_4_ * fVar30)
              ;
              auVar45._4_4_ = local_98.m128[1] - (auVar135._4_4_ * fVar49 + auVar120._4_4_ * fVar30)
              ;
              auVar45._8_4_ = local_98.m128[2] - (auVar135._8_4_ * fVar49 + auVar120._8_4_ * fVar30)
              ;
              auVar45._12_4_ = local_98.m128[3] - (auVar135._12_4_ * fVar49 + fVar29 * fVar30);
              auVar60._0_4_ = local_88 - (fVar49 * auVar128._0_4_ + fVar30 * auVar105._0_4_);
              auVar60._4_4_ = fStack_84 - (fVar49 * auVar128._4_4_ + fVar30 * auVar105._4_4_);
              auVar60._8_4_ = fStack_80 - (fVar49 * auVar128._8_4_ + fVar30 * auVar105._8_4_);
              auVar60._12_4_ = fStack_7c - (fVar49 * auVar128._12_4_ + fVar30 * fVar28);
              auVar46 = minps(auVar45,ZEXT816(0));
              auVar61 = maxps(auVar60,ZEXT816(0));
              auVar132._0_4_ = auVar135._0_4_ + auVar46._0_4_;
              auVar132._4_4_ = auVar135._4_4_ + auVar46._4_4_;
              auVar132._8_4_ = auVar135._8_4_ + auVar46._8_4_;
              auVar135._12_4_ = auVar135._12_4_ + auVar46._12_4_;
              auVar135._0_12_ = auVar132;
              auVar31._0_8_ =
                   CONCAT44(auVar46._4_4_ + auVar120._4_4_,auVar46._0_4_ + auVar120._0_4_);
              auVar31._8_4_ = auVar46._8_4_ + auVar120._8_4_;
              auVar125._0_4_ = auVar128._0_4_ + auVar61._0_4_;
              auVar125._4_4_ = auVar128._4_4_ + auVar61._4_4_;
              auVar125._8_4_ = auVar128._8_4_ + auVar61._8_4_;
              auVar128._12_4_ = auVar128._12_4_ + auVar61._12_4_;
              auVar128._0_12_ = auVar125;
              auVar51._0_8_ =
                   CONCAT44(auVar61._4_4_ + auVar105._4_4_,auVar61._0_4_ + auVar105._0_4_);
              auVar51._8_4_ = auVar61._8_4_ + auVar105._8_4_;
              sVar26 = sVar26 + 1;
              auVar105._8_4_ = auVar51._8_4_;
              auVar105._0_8_ = auVar51._0_8_;
              auVar105._12_4_ = auVar61._12_4_ + fVar28;
              auVar120._8_4_ = auVar31._8_4_;
              auVar120._0_8_ = auVar31._0_8_;
              auVar120._12_4_ = auVar46._12_4_ + fVar29;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          else {
            auVar31._8_4_ = auVar120._8_4_;
            auVar31._0_8_ = auVar120._0_8_;
            auVar51._8_4_ = auVar105._8_4_;
            auVar51._0_8_ = auVar105._0_8_;
          }
        }
        fVar13 = (float)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        uVar14 = (ulong)(uint)fVar13;
        aVar136.m128[3] = (float)geomID;
        aVar136._0_12_ = auVar132;
        aVar129.m128[3] = (float)uVar15;
        aVar129._0_12_ = auVar125;
        aVar47.m128[3] = fVar13;
        aVar47._0_12_ = auVar31;
        aVar62.m128[3] = fVar13;
        aVar62._0_12_ = auVar51;
        auVar79._0_4_ =
             auVar125._0_4_ * 0.5 + auVar51._0_4_ * 0.5 + auVar132._0_4_ * 0.5 + auVar31._0_4_ * 0.5
        ;
        auVar79._4_4_ =
             auVar125._4_4_ * 0.5 + auVar51._4_4_ * 0.5 + auVar132._4_4_ * 0.5 + auVar31._4_4_ * 0.5
        ;
        auVar79._8_4_ =
             auVar125._8_4_ * 0.5 + auVar51._8_4_ * 0.5 + auVar132._8_4_ * 0.5 + auVar31._8_4_ * 0.5
        ;
        auVar79._12_4_ = (float)uVar15 * 0.5 + fVar13 * 0.5 + (float)geomID * 0.5 + fVar13 * 0.5;
        BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        aVar121.m128 = (__m128)minps(aVar121.m128,aVar136.m128);
        local_230 = local_230 + 1;
        local_228 = local_228 + uVar14;
        bVar27 = local_288 < uVar14;
        if (local_288 <= uVar14) {
          local_288 = uVar14;
        }
        pPVar7 = prims->items;
        pPVar7[local_220].lbounds.bounds0.lower.field_0 = aVar136;
        aVar162.m128 = (__m128)maxps(aVar162.m128,aVar129.m128);
        pPVar7[local_220].lbounds.bounds0.upper.field_0 = aVar129;
        aVar156.m128 = (__m128)minps(aVar156.m128,aVar47.m128);
        pPVar7[local_220].lbounds.bounds1.lower.field_0 = aVar47;
        local_1e8.m128 = (__m128)maxps(local_1e8.m128,aVar62.m128);
        pPVar7[local_220].lbounds.bounds1.upper.field_0 = aVar62;
        pPVar7[local_220].time_range = BVar3;
        local_1d8.m128 = (__m128)minps(local_1d8.m128,auVar79);
        aVar48.m128 = (__m128)maxps(aVar48.m128,auVar79);
        fVar13 = BVar3.lower;
        if (fVar13 <= fVar175) {
          fVar175 = fVar13;
        }
        fVar29 = BVar3.upper;
        fVar30 = fVar29;
        if (fVar29 <= fVar99) {
          fVar30 = fVar99;
        }
        uVar23 = (int)((uint)bVar27 << 0x1f) >> 0x1f;
        uVar63 = (int)((uint)bVar27 << 0x1f) >> 0x1f;
        fVar50 = (float)(~uVar23 & (uint)fVar50 | (uint)fVar13 & uVar23);
        fVar64 = (float)(~uVar63 & (uint)fVar64 | (uint)fVar29 & uVar63);
        local_220 = local_220 + 1;
        fVar99 = fVar30;
      }
LAB_009dcdbe:
      uVar15 = uVar15 + 1;
    } while (uVar15 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_230;
  }
  else {
    fVar50 = 0.0;
    fVar64 = 1.0;
    fVar175 = 1.0;
    fVar99 = 0.0;
    local_288 = 0;
    local_228 = 0;
    local_1d8 = _DAT_01f7a9f0;
    local_1e8 = _DAT_01f7aa00;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar121;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar162;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar156;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_1e8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_1d8;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar48;
  (__return_storage_ptr__->time_range).lower = fVar175;
  (__return_storage_ptr__->time_range).upper = fVar99;
  __return_storage_ptr__->num_time_segments = local_228;
  __return_storage_ptr__->max_num_time_segments = local_288;
  (__return_storage_ptr__->max_time_range).lower = fVar50;
  (__return_storage_ptr__->max_time_range).upper = fVar64;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }